

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O0

quint32 __thiscall
HPack::FieldLookupTable::indexOf(FieldLookupTable *this,QByteArray *name,QByteArray *value)

{
  bool bVar1;
  difference_type dVar2;
  pointer pSVar3;
  undefined8 in_RSI;
  FieldLookupTable *in_RDI;
  long in_FS_OFFSET;
  HeaderField *found;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *table;
  const_iterator pos;
  SearchEntry key;
  const_iterator staticPos;
  HeaderField field;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QByteArray *in_stack_ffffffffffffff28;
  HeaderField *key_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  CompareMode mode;
  FieldLookupTable *field_00;
  quint32 local_a4;
  _Self local_a0;
  _Self local_98;
  SearchEntry local_90;
  char local_70 [32];
  HeaderField *local_50;
  HeaderField *local_48;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_40;
  HeaderField local_38;
  long local_8;
  
  mode = (CompareMode)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  field_00 = in_RDI;
  staticPart();
  memset(&local_38,0,0x30);
  local_38.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_38.name.d.size = -0x5555555555555556;
  local_38.value.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.value.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_38.value.d.size = -0x5555555555555556;
  HeaderField::HeaderField
            ((HeaderField *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(QByteArray *)in_RDI);
  local_40._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_40._M_current = (HeaderField *)findInStaticPart((HeaderField *)field_00,mode);
  local_48 = (HeaderField *)
             std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
                       ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
    ::operator->(&local_40);
    bVar1 = ::operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                         ,in_stack_ffffffffffffff28);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
      ::operator->(&local_40);
      bVar1 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff28);
      if (bVar1) {
        local_50 = (HeaderField *)
                   std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                             ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                              in_RDI);
        dVar2 = __gnu_cxx::operator-
                          ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                            *)in_RDI,
                           (__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_a4 = (int)dVar2 + 1;
        goto LAB_00297805;
      }
    }
  }
  if ((in_RDI->useIndex & 1U) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)in_stack_ffffffffffffff28,(int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::critical(local_70,"lookup in dynamic table requires search index enabled");
    local_a4 = 0;
  }
  else {
    local_90.field = (HeaderField *)0xaaaaaaaaaaaaaaaa;
    local_90.chunk = (Chunk *)0xaaaaaaaaaaaaaaaa;
    local_90.offset = 0xaaaaaaaa;
    local_90._20_4_ = 0xaaaaaaaa;
    local_90.table = (FieldLookupTable *)0xaaaaaaaaaaaaaaaa;
    SearchEntry::SearchEntry(&local_90,&local_38,(Chunk *)0x0,0,in_RDI);
    local_98._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_98._M_node =
         (_Base_ptr)
         std::
         set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
         ::lower_bound((set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
                        *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (key_type *)0x297752);
    local_a0._M_node =
         (_Base_ptr)
         std::
         set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
         ::end((set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    bVar1 = std::operator!=(&local_98,&local_a0);
    if (bVar1) {
      pSVar3 = std::_Rb_tree_const_iterator<HPack::FieldLookupTable::SearchEntry>::operator->
                         ((_Rb_tree_const_iterator<HPack::FieldLookupTable::SearchEntry> *)0x297798)
      ;
      key_00 = pSVar3->field;
      bVar1 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           &key_00->name);
      if ((bVar1) &&
         (bVar1 = ::operator==((QByteArray *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               &key_00->name), bVar1)) {
        std::_Rb_tree_const_iterator<HPack::FieldLookupTable::SearchEntry>::operator*
                  ((_Rb_tree_const_iterator<HPack::FieldLookupTable::SearchEntry> *)0x2977d8);
        local_a4 = keyToIndex((FieldLookupTable *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (SearchEntry *)key_00);
        goto LAB_00297805;
      }
    }
    local_a4 = 0;
  }
LAB_00297805:
  HeaderField::~HeaderField((HeaderField *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a4;
}

Assistant:

quint32 FieldLookupTable::indexOf(const QByteArray &name, const QByteArray &value)const
{
    // Start from the static part first:
    const auto &table = staticPart();
    const HeaderField field(name, value);
    const auto staticPos = findInStaticPart(field, CompareMode::nameAndValue);
    if (staticPos != table.end()) {
        if (staticPos->name == name && staticPos->value == value)
            return quint32(staticPos - table.begin() + 1);
    }

    // Now we have to lookup in our dynamic part ...
    if (!useIndex) {
        qCritical("lookup in dynamic table requires search index enabled");
        return 0;
    }

    const SearchEntry key(&field, nullptr, 0, this);
    const auto pos = searchIndex.lower_bound(key);
    if (pos != searchIndex.end()) {
        const HeaderField &found = *pos->field;
        if (found.name == name && found.value == value)
            return keyToIndex(*pos);
    }

    return 0;
}